

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

Wlc_Ntk_t * Wlc_NtkDupDfs(Wlc_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  char *__s;
  int *piVar4;
  Vec_Int_t *vFanins;
  Wlc_Ntk_t *pNew;
  long lVar5;
  Vec_Int_t *pVVar6;
  char *__dest;
  long lVar7;
  size_t sVar8;
  
  uVar1 = p->nObjsAlloc;
  if ((p->vCopies).nCap < (int)uVar1) {
    piVar4 = (p->vCopies).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
    }
    (p->vCopies).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vCopies).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vCopies).nSize = uVar1;
  vFanins = (Vec_Int_t *)malloc(0x10);
  vFanins->nCap = 100;
  vFanins->nSize = 0;
  piVar4 = (int *)malloc(400);
  vFanins->pArray = piVar4;
  pNew = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  if (0 < (p->vCis).nSize) {
    lVar7 = 0;
    do {
      iVar2 = (p->vCis).pArray[lVar7];
      if ((iVar2 < 1) || (p->nObjsAlloc <= iVar2)) goto LAB_002fb88b;
      Wlc_ObjDup(pNew,p,iVar2,vFanins);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p->vCis).nSize);
  }
  if (0 < (p->vCos).nSize) {
    lVar7 = 0;
    do {
      iVar2 = (p->vCos).pArray[lVar7];
      if ((iVar2 < 1) || (p->nObjsAlloc <= iVar2)) goto LAB_002fb88b;
      Wlc_NtkDupDfs_rec(pNew,p,iVar2,vFanins);
      lVar7 = lVar7 + 1;
      iVar2 = (p->vCos).nSize;
    } while (lVar7 < iVar2);
    if (0 < iVar2) {
      lVar7 = 0;
      do {
        iVar2 = (p->vCos).pArray[lVar7];
        lVar5 = (long)iVar2;
        if ((lVar5 < 1) || (p->nObjsAlloc <= iVar2)) {
LAB_002fb88b:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlc.h"
                        ,0x9d,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        if ((p->vCopies).nSize <= iVar2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = (p->vCopies).pArray[lVar5];
        if (((long)iVar2 < 1) || (pNew->nObjsAlloc <= iVar2)) goto LAB_002fb88b;
        Wlc_ObjSetCo(pNew,pNew->pObjs + iVar2,*(uint *)(p->pObjs + lVar5) >> 9 & 1);
        lVar7 = lVar7 + 1;
      } while (lVar7 < (p->vCos).nSize);
    }
  }
  pVVar3 = p->vInits;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    iVar2 = pVVar3->nSize;
    pVVar6->nSize = iVar2;
    pVVar6->nCap = iVar2;
    if ((long)iVar2 == 0) {
      sVar8 = 0;
      piVar4 = (int *)0x0;
    }
    else {
      sVar8 = (long)iVar2 << 2;
      piVar4 = (int *)malloc(sVar8);
    }
    pVVar6->pArray = piVar4;
    memcpy(piVar4,pVVar3->pArray,sVar8);
    pNew->vInits = pVVar6;
  }
  __s = p->pInits;
  if (__s != (char *)0x0) {
    sVar8 = strlen(__s);
    __dest = (char *)malloc(sVar8 + 1);
    strcpy(__dest,__s);
    pNew->pInits = __dest;
  }
  if (vFanins->pArray != (int *)0x0) {
    free(vFanins->pArray);
  }
  free(vFanins);
  return pNew;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupDfs( Wlc_Ntk_t * p )
{
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    Vec_Int_t * vFanins;
    int i;
    Wlc_NtkCleanCopy( p );
    vFanins = Vec_IntAlloc( 100 );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    Wlc_NtkForEachCi( p, pObj, i )
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        Wlc_NtkDupDfs_rec( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, pObj), pObj->fIsFi );
    if ( p->vInits )
    pNew->vInits = Vec_IntDup( p->vInits );
    if ( p->pInits )
    pNew->pInits = Abc_UtilStrsav( p->pInits );
    Vec_IntFree( vFanins );
    return pNew;
}